

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZDICT_removeDictItem(dictItem *table,U32 id)

{
  U32 UVar1;
  U32 UVar2;
  dictItem *pdVar3;
  dictItem *pdVar4;
  U32 u;
  U32 max;
  U32 id_local;
  dictItem *table_local;
  
  UVar1 = table->pos;
  u = id;
  if (id != 0) {
    for (; u < UVar1 - 1; u = u + 1) {
      pdVar3 = table + u;
      pdVar4 = table + (u + 1);
      UVar2 = pdVar4->length;
      pdVar3->pos = pdVar4->pos;
      pdVar3->length = UVar2;
      pdVar3->savings = pdVar4->savings;
    }
    table->pos = table->pos - 1;
  }
  return;
}

Assistant:

static void ZDICT_removeDictItem(dictItem* table, U32 id)
{
    /* convention : table[0].pos stores nb of elts */
    U32 const max = table[0].pos;
    U32 u;
    if (!id) return;   /* protection, should never happen */
    for (u=id; u<max-1; u++)
        table[u] = table[u+1];
    table->pos--;
}